

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O3

void Cba_BlastDividerSigned
               (Gia_Man_t *pNew,int *pNum,int nNum,int *pDiv,int nDiv,int fQuo,Vec_Int_t *vRes)

{
  int *pNum_00;
  int iVar1;
  int iVar2;
  int iData1;
  Vec_Int_t *vRes_00;
  int *piVar3;
  Vec_Int_t *vRes_01;
  Vec_Int_t *vRes_02;
  Vec_Int_t *vRes_03;
  Vec_Int_t *vRes_04;
  Vec_Int_t *vRes_05;
  Vec_Int_t *vRes_06;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  vRes_00 = (Vec_Int_t *)malloc(0x10);
  iVar1 = nNum;
  if (nNum - 1U < 0xf) {
    iVar1 = 0x10;
  }
  vRes_00->nSize = 0;
  vRes_00->nCap = iVar1;
  if (iVar1 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar1 * 4);
  }
  vRes_00->pArray = piVar3;
  vRes_01 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < nDiv - 1U) {
    iVar2 = nDiv;
  }
  vRes_01->nSize = 0;
  vRes_01->nCap = iVar2;
  if (iVar2 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar2 << 2);
  }
  vRes_01->pArray = piVar3;
  vRes_02 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < (nDiv + nNum) - 1U) {
    iVar2 = nDiv + nNum;
  }
  vRes_02->nSize = 0;
  vRes_02->nCap = iVar2;
  lVar6 = (long)iVar2;
  if (iVar2 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc(lVar6 * 4);
  }
  vRes_02->pArray = piVar3;
  vRes_03 = (Vec_Int_t *)malloc(0x10);
  vRes_03->nSize = 0;
  vRes_03->nCap = iVar2;
  if (iVar2 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc(lVar6 * 4);
  }
  vRes_03->pArray = piVar3;
  vRes_04 = (Vec_Int_t *)malloc(0x10);
  vRes_04->nSize = 0;
  vRes_04->nCap = iVar2;
  if (iVar2 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc(lVar6 * 4);
  }
  vRes_04->pArray = piVar3;
  vRes_05 = (Vec_Int_t *)malloc(0x10);
  vRes_05->nSize = 0;
  vRes_05->nCap = iVar2;
  if (iVar2 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc(lVar6 << 2);
  }
  vRes_05->pArray = piVar3;
  vRes_06 = (Vec_Int_t *)malloc(0x10);
  vRes_06->nSize = 0;
  vRes_06->nCap = iVar1;
  if (iVar1 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar1 << 2);
  }
  vRes_06->pArray = piVar3;
  iVar1 = Gia_ManHashXor(pNew,pNum[(long)nNum + -1],pDiv[(long)nDiv + -1]);
  Cba_BlastMinus(pNew,pNum,nNum,vRes_00);
  Cba_BlastMinus(pNew,pDiv,nDiv,vRes_01);
  Cba_BlastDivider(pNew,pNum,nNum,pDiv,nDiv,fQuo,vRes_02);
  piVar3 = vRes_01->pArray;
  Cba_BlastDivider(pNew,pNum,nNum,piVar3,nDiv,fQuo,vRes_03);
  pNum_00 = vRes_00->pArray;
  Cba_BlastDivider(pNew,pNum_00,nNum,pDiv,nDiv,fQuo,vRes_04);
  Cba_BlastDivider(pNew,pNum_00,nNum,piVar3,nDiv,fQuo,vRes_05);
  vRes->nSize = 0;
  if (nNum < 1) {
    Cba_BlastMinus(pNew,vRes->pArray,nNum,vRes_06);
  }
  else {
    uVar5 = 0;
    uVar4 = (ulong)(uint)vRes_03->nSize;
    if (vRes_03->nSize < 1) {
      uVar4 = uVar5;
    }
    do {
      if ((((uVar4 == uVar5) || ((long)vRes_02->nSize <= (long)uVar5)) ||
          (iVar2 = Gia_ManHashMux(pNew,pDiv[(long)nDiv + -1],vRes_03->pArray[uVar5],
                                  vRes_02->pArray[uVar5]), (long)vRes_05->nSize <= (long)uVar5)) ||
         ((long)vRes_04->nSize <= (long)uVar5)) goto LAB_008c3be8;
      iData1 = Gia_ManHashMux(pNew,pDiv[(long)nDiv + -1],vRes_05->pArray[uVar5],
                              vRes_04->pArray[uVar5]);
      iVar2 = Gia_ManHashMux(pNew,pNum[(long)nNum + -1],iData1,iVar2);
      Vec_IntPush(vRes,iVar2);
      uVar5 = uVar5 + 1;
    } while ((uint)nNum != uVar5);
    Cba_BlastMinus(pNew,vRes->pArray,nNum,vRes_06);
    if (0 < nNum) {
      uVar5 = 0;
      uVar4 = (ulong)(uint)vRes_06->nSize;
      if (vRes_06->nSize < 1) {
        uVar4 = uVar5;
      }
      do {
        iVar2 = iVar1;
        if (fQuo == 0) {
          iVar2 = pNum[(long)nNum + -1];
        }
        if ((uVar4 == uVar5) || ((long)vRes->nSize <= (long)uVar5)) {
LAB_008c3be8:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = Gia_ManHashMux(pNew,iVar2,vRes_06->pArray[uVar5],vRes->pArray[uVar5]);
        if ((long)vRes->nSize <= (long)uVar5) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        vRes->pArray[uVar5] = iVar2;
        uVar5 = uVar5 + 1;
      } while ((uint)nNum != uVar5);
    }
  }
  if (pNum_00 != (int *)0x0) {
    free(pNum_00);
  }
  free(vRes_00);
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(vRes_01);
  if (vRes_02->pArray != (int *)0x0) {
    free(vRes_02->pArray);
  }
  free(vRes_02);
  if (vRes_03->pArray != (int *)0x0) {
    free(vRes_03->pArray);
  }
  free(vRes_03);
  if (vRes_04->pArray != (int *)0x0) {
    free(vRes_04->pArray);
  }
  free(vRes_04);
  if (vRes_05->pArray != (int *)0x0) {
    free(vRes_05->pArray);
  }
  free(vRes_05);
  if (vRes_06->pArray != (int *)0x0) {
    free(vRes_06->pArray);
  }
  free(vRes_06);
  if (vRes->nSize != nNum) {
    __assert_fail("Vec_IntSize(vRes) == nNum",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaBlast.c"
                  ,0x1f0,
                  "void Cba_BlastDividerSigned(Gia_Man_t *, int *, int, int *, int, int, Vec_Int_t *)"
                 );
  }
  return;
}

Assistant:

void Cba_BlastDividerSigned( Gia_Man_t * pNew, int * pNum, int nNum, int * pDiv, int nDiv, int fQuo, Vec_Int_t * vRes )
{
    Vec_Int_t * vNum   = Vec_IntAlloc( nNum );
    Vec_Int_t * vDiv   = Vec_IntAlloc( nDiv );
    Vec_Int_t * vRes00 = Vec_IntAlloc( nNum + nDiv );
    Vec_Int_t * vRes01 = Vec_IntAlloc( nNum + nDiv );
    Vec_Int_t * vRes10 = Vec_IntAlloc( nNum + nDiv );
    Vec_Int_t * vRes11 = Vec_IntAlloc( nNum + nDiv );
    Vec_Int_t * vRes2  = Vec_IntAlloc( nNum );
    int k, iDiffSign   = Gia_ManHashXor( pNew, pNum[nNum-1], pDiv[nDiv-1] );
    Cba_BlastMinus( pNew, pNum, nNum, vNum );
    Cba_BlastMinus( pNew, pDiv, nDiv, vDiv );
    Cba_BlastDivider( pNew,               pNum, nNum,               pDiv, nDiv, fQuo, vRes00 );
    Cba_BlastDivider( pNew,               pNum, nNum, Vec_IntArray(vDiv), nDiv, fQuo, vRes01 );
    Cba_BlastDivider( pNew, Vec_IntArray(vNum), nNum,               pDiv, nDiv, fQuo, vRes10 );
    Cba_BlastDivider( pNew, Vec_IntArray(vNum), nNum, Vec_IntArray(vDiv), nDiv, fQuo, vRes11 );
    Vec_IntClear( vRes );
    for ( k = 0; k < nNum; k++ )
    {
        int Data0 =  Gia_ManHashMux( pNew, pDiv[nDiv-1], Vec_IntEntry(vRes01,k), Vec_IntEntry(vRes00,k) );
        int Data1 =  Gia_ManHashMux( pNew, pDiv[nDiv-1], Vec_IntEntry(vRes11,k), Vec_IntEntry(vRes10,k) );
        Vec_IntPush( vRes, Gia_ManHashMux(pNew, pNum[nNum-1], Data1, Data0) );
    }
    Cba_BlastMinus( pNew, Vec_IntArray(vRes), nNum, vRes2 );
    for ( k = 0; k < nNum; k++ )
        Vec_IntWriteEntry( vRes, k, Gia_ManHashMux(pNew, fQuo ? iDiffSign : pNum[nNum-1], Vec_IntEntry(vRes2,k), Vec_IntEntry(vRes,k)) );
    Vec_IntFree( vNum );
    Vec_IntFree( vDiv );
    Vec_IntFree( vRes00 );
    Vec_IntFree( vRes01 );
    Vec_IntFree( vRes10 );
    Vec_IntFree( vRes11 );
    Vec_IntFree( vRes2 );
    assert( Vec_IntSize(vRes) == nNum );
}